

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O1

void UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
               (TestResults *results,float (*expected) [3] [3],float (*actual) [3] [3],int rows,
               int columns,float *tolerance,TestDetails *details)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ostream *poVar4;
  char *failure;
  float (*pafVar5) [3];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float (*pafVar9) [3];
  byte bVar10;
  ulong uVar11;
  MemoryOutStream stream;
  undefined1 local_1c8 [408];
  
  if (0 < rows) {
    uVar6 = (ulong)(uint)columns;
    bVar3 = true;
    uVar11 = 0;
    pafVar5 = *expected;
    pafVar9 = *actual;
    do {
      bVar10 = 1;
      if (0 < columns) {
        uVar7 = 0;
        do {
          fVar1 = (*(float (*) [3])*pafVar5)[uVar7];
          fVar2 = (*(float (*) [3])*pafVar9)[uVar7];
          bVar10 = bVar10 & (fVar2 <= *tolerance + fVar1 && fVar1 - *tolerance <= fVar2);
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      bVar3 = (bool)(bVar3 & bVar10);
      uVar11 = uVar11 + 1;
      pafVar9 = pafVar9 + 1;
      pafVar5 = pafVar5 + 1;
    } while (uVar11 != (uint)rows);
    if (!bVar3) {
      MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Expected [ ",0xb);
      uVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar7 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>
                               ((double)(*(float (*) [3])(*expected)[0])[uVar7]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar11 = uVar11 + 1;
        expected = (float (*) [3] [3])((long)expected + 0xc);
      } while (uVar11 != (uint)rows);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] +/- ",6);
      poVar4 = std::ostream::_M_insert<double>((double)*tolerance);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," but was [ ",0xb);
      uVar11 = 1;
      if (1 < rows) {
        uVar11 = (ulong)(uint)rows;
      }
      uVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[ ",2);
        if (0 < columns) {
          uVar8 = 0;
          do {
            poVar4 = std::ostream::_M_insert<double>((double)(*(float (*) [3])(*actual)[0])[uVar8]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"] ",2);
        uVar7 = uVar7 + 1;
        actual = (float (*) [3] [3])((long)actual + 0xc);
      } while (uVar7 != uVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"]",1);
      failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
      TestResults::OnTestFailure(results,details,failure);
      MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8,&MemoryOutStream::VTT);
      std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x90));
    }
  }
  return;
}

Assistant:

void CheckArray2DClose(TestResults& results, Expected const& expected, Actual const& actual,
                   int const rows, int const columns, Tolerance const& tolerance, TestDetails const& details)
{
    bool equal = true;
    for (int i = 0; i < rows; ++i)
        equal &= ArrayAreClose(expected[i], actual[i], columns, tolerance);

    if (!equal)
    {
        UnitTest::MemoryOutStream stream;

        stream << "Expected [ ";    

		for (int expectedRow = 0; expectedRow < rows; ++expectedRow)
        {
            stream << "[ ";
            for (int expectedColumn = 0; expectedColumn < columns; ++expectedColumn)
                stream << expected[expectedRow][expectedColumn] << " ";
            stream << "] ";
        }

		stream << "] +/- " << tolerance << " but was [ ";

		for (int actualRow = 0; actualRow < rows; ++actualRow)
        {
            stream << "[ ";
            for (int actualColumn = 0; actualColumn < columns; ++actualColumn)
                stream << actual[actualRow][actualColumn] << " ";
            stream << "] ";
        }

		stream << "]";

        results.OnTestFailure(details, stream.GetText());
    }
}